

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_font_bake_convert(void *out_memory,int img_width,int img_height,void *in_memory)

{
  byte *local_38;
  nk_byte *src;
  nk_rune *dst;
  int n;
  void *in_memory_local;
  int img_height_local;
  int img_width_local;
  void *out_memory_local;
  
  if (out_memory == (void *)0x0) {
    __assert_fail("out_memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32bd,"void nk_font_bake_convert(void *, int, int, const void *)");
  }
  if (in_memory == (void *)0x0) {
    __assert_fail("in_memory",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32be,"void nk_font_bake_convert(void *, int, int, const void *)");
  }
  if (img_width == 0) {
    __assert_fail("img_width",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32bf,"void nk_font_bake_convert(void *, int, int, const void *)");
  }
  if (img_height == 0) {
    __assert_fail("img_height",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x32c0,"void nk_font_bake_convert(void *, int, int, const void *)");
  }
  if ((((out_memory != (void *)0x0) && (in_memory != (void *)0x0)) && (img_height != 0)) &&
     (img_width != 0)) {
    local_38 = (byte *)in_memory;
    src = (nk_byte *)out_memory;
    for (dst._4_4_ = img_width * img_height; 0 < dst._4_4_; dst._4_4_ = dst._4_4_ + -1) {
      *(uint *)src = (uint)*local_38 << 0x18 | 0xffffff;
      local_38 = local_38 + 1;
      src = src + 4;
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_font_bake_convert(void *out_memory, int img_width, int img_height,
    const void *in_memory)
{
    int n = 0;
    nk_rune *dst;
    const nk_byte *src;

    NK_ASSERT(out_memory);
    NK_ASSERT(in_memory);
    NK_ASSERT(img_width);
    NK_ASSERT(img_height);
    if (!out_memory || !in_memory || !img_height || !img_width) return;

    dst = (nk_rune*)out_memory;
    src = (const nk_byte*)in_memory;
    for (n = (int)(img_width * img_height); n > 0; n--)
        *dst++ = ((nk_rune)(*src++) << 24) | 0x00FFFFFF;
}